

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plutosvg.c
# Opt level: O0

_Bool apply_radial_gradient(render_state_t *state,render_context_t *context,element_t *element)

{
  _Bool _Var1;
  float cx_00;
  float cy_00;
  float cr;
  float fx_00;
  float fy_00;
  float _fy;
  float _fx;
  float _r;
  float _cy;
  float _cx;
  length_t fy;
  length_t fx;
  length_t r;
  length_t cy;
  length_t cx;
  gradient_stop_array_t stops;
  plutovg_matrix_t transform;
  plutovg_spread_method_t spread;
  units_type_t units;
  element_t *ref;
  element_t *peStack_78;
  int i;
  element_t *current;
  radial_gradient_attributes_t attributes;
  element_t *element_local;
  render_context_t *context_local;
  render_state_t *state_local;
  
  attributes.fy = element;
  memset(&current,0,0x48);
  peStack_78 = attributes.fy;
  for (ref._4_4_ = 0; ref._4_4_ < 0x80; ref._4_4_ = ref._4_4_ + 1) {
    collect_gradient_attributes(peStack_78,(gradient_attributes_t *)&current);
    if (peStack_78->id == 0xc) {
      if ((attributes.base.stops == (element_t *)0x0) &&
         (_Var1 = has_attribute(peStack_78,5), _Var1)) {
        attributes.base.stops = peStack_78;
      }
      if ((attributes.cx == (element_t *)0x0) && (_Var1 = has_attribute(peStack_78,6), _Var1)) {
        attributes.cx = peStack_78;
      }
      if ((attributes.cy == (element_t *)0x0) && (_Var1 = has_attribute(peStack_78,0x17), _Var1)) {
        attributes.cy = peStack_78;
      }
      if ((attributes.r == (element_t *)0x0) && (_Var1 = has_attribute(peStack_78,0xc), _Var1)) {
        attributes.r = peStack_78;
      }
      if ((attributes.fx == (element_t *)0x0) && (_Var1 = has_attribute(peStack_78,0xd), _Var1)) {
        attributes.fx = peStack_78;
      }
    }
    peStack_78 = resolve_href(context->document,peStack_78);
    if ((peStack_78 == (element_t *)0x0) || ((peStack_78->id != 8 && (peStack_78->id != 0xc))))
    break;
  }
  if (attributes.base.transform == (element_t *)0x0) {
    state_local._7_1_ = false;
  }
  else {
    fill_gradient_attributes(attributes.fy,(gradient_attributes_t *)&current);
    if (attributes.base.stops == (element_t *)0x0) {
      attributes.base.stops = attributes.fy;
    }
    if (attributes.cx == (element_t *)0x0) {
      attributes.cx = attributes.fy;
    }
    if (attributes.cy == (element_t *)0x0) {
      attributes.cy = attributes.fy;
    }
    transform.f = 0.0;
    transform.e = 0.0;
    stops.size = 0x3f800000;
    transform.a = 0.0;
    transform.b = 1.0;
    transform.c = 0.0;
    transform.d = 0.0;
    memset(&cx,0,0x508);
    resolve_gradient_attributes
              (context,state,(gradient_attributes_t *)&current,(units_type_t *)&transform.f,
               (plutovg_spread_method_t *)&transform.e,(plutovg_matrix_t *)&stops.size,
               (gradient_stop_array_t *)&cx);
    cy.value = 50.0;
    cy.type = length_type_percent;
    r.value = 50.0;
    r.type = length_type_percent;
    fx.value = 50.0;
    fx.type = length_type_percent;
    fy.value = 50.0;
    fy.type = length_type_percent;
    _cy = 50.0;
    _cx = 2.8026e-45;
    parse_length(attributes.base.stops,5,&cy,true,false);
    parse_length(attributes.cx,6,&r,true,false);
    parse_length(attributes.cy,0x17,&fx,false,false);
    if (attributes.r == (element_t *)0x0) {
      parse_length(attributes.base.stops,5,&fy,true,false);
    }
    else {
      parse_length(attributes.r,0xc,&fy,true,false);
    }
    if (attributes.fx == (element_t *)0x0) {
      parse_length(attributes.cx,6,(length_t *)&_cy,true,false);
    }
    else {
      parse_length(attributes.fx,0xd,(length_t *)&_cy,true,false);
    }
    cx_00 = resolve_gradient_length(state,&cy,(units_type_t)transform.f,'x');
    cy_00 = resolve_gradient_length(state,&r,(units_type_t)transform.f,'y');
    cr = resolve_gradient_length(state,&fx,(units_type_t)transform.f,'o');
    fx_00 = resolve_gradient_length(state,&fy,(units_type_t)transform.f,'x');
    fy_00 = resolve_gradient_length(state,(length_t *)&_cy,(units_type_t)transform.f,'y');
    plutovg_canvas_set_radial_gradient
              (context->canvas,cx_00,cy_00,cr,fx_00,fy_00,0.0,(plutovg_spread_method_t)transform.e,
               (plutovg_gradient_stop_t *)&cx,(int)stops.data[0x3f].color.b,
               (plutovg_matrix_t *)&stops.size);
    state_local._7_1_ = true;
  }
  return state_local._7_1_;
}

Assistant:

static bool apply_radial_gradient(render_state_t* state, const render_context_t* context, const element_t* element)
{
    radial_gradient_attributes_t attributes = {0};
    const element_t* current = element;
    for(int i = 0; i < MAX_GRADIENT_DEPTH; ++i) {
        collect_gradient_attributes(current, &attributes.base);
        if(current->id == TAG_RADIAL_GRADIENT) {
            if(attributes.cx == NULL && has_attribute(current, ATTR_CX))
                attributes.cx = current;
            if(attributes.cy == NULL && has_attribute(current, ATTR_CY))
                attributes.cy = current;
            if(attributes.r == NULL && has_attribute(current, ATTR_R))
                attributes.r = current;
            if(attributes.fx == NULL && has_attribute(current, ATTR_FX))
                attributes.fx = current;
            if(attributes.fy == NULL && has_attribute(current, ATTR_FY)) {
                attributes.fy = current;
            }
        }

        const element_t* ref = resolve_href(context->document, current);
        if(ref == NULL || !(ref->id == TAG_LINEAR_GRADIENT || ref->id == TAG_RADIAL_GRADIENT))
            break;
        current = ref;
    }

    if(attributes.base.stops == NULL)
        return false;
    fill_gradient_attributes(element, &attributes.base);
    if(attributes.cx == NULL) attributes.cx = element;
    if(attributes.cy == NULL) attributes.cy = element;
    if(attributes.r == NULL) attributes.r = element;

    units_type_t units = units_type_object_bounding_box;
    plutovg_spread_method_t spread = PLUTOVG_SPREAD_METHOD_PAD;
    plutovg_matrix_t transform = {1, 0, 0, 1, 0, 0};
    gradient_stop_array_t stops = {0};
    resolve_gradient_attributes(context, state, &attributes.base, &units, &spread, &transform, &stops);

    length_t cx = {50, length_type_percent};
    length_t cy = {50, length_type_percent};
    length_t r = {50, length_type_percent};
    length_t fx = {50, length_type_percent};
    length_t fy = {50, length_type_percent};

    parse_length(attributes.cx, ATTR_CX, &cx, true, false);
    parse_length(attributes.cy, ATTR_CY, &cy, true, false);
    parse_length(attributes.r, ATTR_R, &r, false, false);

    if(attributes.fx) {
        parse_length(attributes.fx, ATTR_FX, &fx, true, false);
    } else {
        parse_length(attributes.cx, ATTR_CX, &fx, true, false);
    }

    if(attributes.fy) {
        parse_length(attributes.fy, ATTR_FY, &fy, true, false);
    } else {
        parse_length(attributes.cy, ATTR_CY, &fy, true, false);
    }

    float _cx = resolve_gradient_length(state, &cx, units, 'x');
    float _cy = resolve_gradient_length(state, &cy, units, 'y');
    float _r = resolve_gradient_length(state, &r, units, 'o');
    float _fx = resolve_gradient_length(state, &fx, units, 'x');
    float _fy = resolve_gradient_length(state, &fy, units, 'y');

    plutovg_canvas_set_radial_gradient(context->canvas, _cx, _cy, _r, _fx, _fy, 0.f, spread, stops.data, stops.size, &transform);
    return true;
}